

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O3

void __thiscall zsummer::log4z::CLogerManager::~CLogerManager(CLogerManager *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _List_node_base *p_Var2;
  FILE *__stream;
  char *pcVar3;
  pointer pcVar4;
  _List_node_base *p_Var5;
  long lVar6;
  
  (this->super_CThread)._vptr_CThread = (_func_int **)&PTR__CLogerManager_0014cb18;
  (this->super_ILog4zManager)._vptr_ILog4zManager = (_func_int **)&PTR__CLogerManager_0014cbc8;
  if (this->m_bRuning == true) {
    this->m_bRuning = false;
    pthread_join((this->super_CThread).m_hThreadID,(void **)0x0);
  }
  (this->m_lock)._vptr_CLock = (_func_int **)&PTR__CLock_0014ccf8;
  pthread_mutex_destroy((pthread_mutex_t *)&(this->m_lock).m_crit);
  p_Var5 = (this->m_logs).
           super__List_base<zsummer::log4z::LogData_*,_std::allocator<zsummer::log4z::LogData_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)&this->m_logs) {
    p_Var2 = p_Var5->_M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  lVar6 = 0;
  do {
    __stream = *(FILE **)((long)&this->m_loggers[9]._handle.m_file + lVar6);
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      *(undefined8 *)((long)&this->m_loggers[9]._handle.m_file + lVar6) = 0;
    }
    pcVar3 = *(char **)((long)&this->m_loggers[9]._path._M_dataplus._M_p + lVar6);
    if (this->m_loggers[9]._path.field_2._M_local_buf + lVar6 != pcVar3) {
      operator_delete(pcVar3,*(long *)((long)&this->m_loggers[9]._path.field_2 + lVar6) + 1);
    }
    pcVar3 = *(char **)((long)&this->m_loggers[9]._pid._M_dataplus._M_p + lVar6);
    if (this->m_loggers[9]._pid.field_2._M_local_buf + lVar6 != pcVar3) {
      operator_delete(pcVar3,*(long *)((long)&this->m_loggers[9]._pid.field_2 + lVar6) + 1);
    }
    pcVar3 = *(char **)((long)&this->m_loggers[9]._name._M_dataplus._M_p + lVar6);
    if (this->m_loggers[9]._name.field_2._M_local_buf + lVar6 != pcVar3) {
      operator_delete(pcVar3,*(long *)((long)&this->m_loggers[9]._name.field_2 + lVar6) + 1);
    }
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != -0x550);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->m_ids)._M_t);
  pcVar4 = (this->m_configFile)._M_dataplus._M_p;
  paVar1 = &(this->m_configFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  (this->m_semaphore)._vptr_CSem = (_func_int **)&PTR__CSem_0014ccc8;
  if ((this->m_semaphore).m_bCreate != true) {
    return;
  }
  (this->m_semaphore).m_bCreate = false;
  sem_destroy((sem_t *)&(this->m_semaphore).m_semid);
  return;
}

Assistant:

~CLogerManager()
	{
		Stop();
	}